

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::SignedCastExpressionSyntax::setChild
          (SignedCastExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  ParenthesizedExpressionSyntax *pPVar2;
  Token TVar3;
  
  if (index == 2) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pPVar2 = (ParenthesizedExpressionSyntax *)0x0;
    }
    else {
      pPVar2 = (ParenthesizedExpressionSyntax *)TokenOrSyntax::node(&child);
    }
    (this->inner).ptr = pPVar2;
  }
  else if (index == 1) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->apostrophe).kind = TVar3.kind;
    (this->apostrophe).field_0x2 = TVar3._2_1_;
    (this->apostrophe).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->apostrophe).rawLen = TVar3.rawLen;
    (this->apostrophe).info = TVar3.info;
  }
  else {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->signing).kind = TVar3.kind;
    (this->signing).field_0x2 = TVar3._2_1_;
    (this->signing).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->signing).rawLen = TVar3.rawLen;
    (this->signing).info = TVar3.info;
  }
  return;
}

Assistant:

void SignedCastExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: signing = child.token(); return;
        case 1: apostrophe = child.token(); return;
        case 2: inner = child.node() ? &child.node()->as<ParenthesizedExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}